

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

BoxArray * __thiscall amrex::BoxArray::refine(BoxArray *this,IntVect *iv)

{
  uint uVar1;
  undefined8 uVar2;
  Long LVar3;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_RSI;
  BoxArray *in_RDI;
  bool bVar4;
  int i;
  int N;
  IntVect shft;
  Box *in_stack_fffffffffffffe18;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *in_stack_fffffffffffffe20;
  int local_1c8;
  int local_1a0;
  int iStack_19c;
  int local_198;
  IntVect local_194;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *local_188;
  Box *local_180;
  IntVect *local_178;
  IntVect *local_170;
  undefined4 local_164;
  IntVect *local_160;
  undefined4 local_154;
  IntVect *local_150;
  undefined4 local_144;
  IntVect *local_140;
  undefined4 local_134;
  int local_128 [2];
  int local_120;
  IndexType *local_118;
  IntVect local_10c;
  IntVect *local_100;
  IntVect *local_f8;
  undefined4 local_ec;
  IntVect *local_e8;
  undefined4 local_dc;
  IntVect *local_d8;
  undefined4 local_cc;
  IntVect *local_c8;
  int *local_c0;
  IntVect *local_b8;
  undefined4 local_ac;
  int *local_a8;
  undefined4 local_9c;
  int *local_98;
  undefined4 local_8c;
  BoxArray *in_stack_ffffffffffffff78;
  
  uniqify(in_stack_ffffffffffffff78);
  std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0xfba30e
            );
  LVar3 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::size
                    ((Vector<amrex::Box,_std::allocator<amrex::Box>_> *)0xfba316);
  for (local_1c8 = 0; local_1c8 < (int)LVar3; local_1c8 = local_1c8 + 1) {
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0xfba33e);
    in_stack_fffffffffffffe18 =
         Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                   (in_stack_fffffffffffffe20,(size_type)in_stack_fffffffffffffe18);
    local_134 = 1;
    bVar4 = true;
    if ((*(int *)&(in_RSI->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_start == 1) &&
       (bVar4 = true,
       *(int *)((long)&(in_RSI->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_start + 4) == 1)) {
      bVar4 = *(int *)&(in_RSI->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                       super__Vector_impl_data._M_finish != 1;
    }
    in_stack_fffffffffffffe20 = in_RSI;
    local_180 = in_stack_fffffffffffffe18;
    if (bVar4) {
      local_188 = in_RSI;
      IntVect::IntVect(&local_194,1);
      local_118 = &in_stack_fffffffffffffe18->btype;
      uVar1 = local_118->itype;
      IntVect::IntVect(&local_10c,uVar1 & 1,uVar1 >> 1 & 1,uVar1 >> 2 & 1);
      local_120 = local_10c.vect[2];
      local_128[0] = local_10c.vect[0];
      local_128[1] = local_10c.vect[1];
      local_1a0 = local_10c.vect[0];
      iStack_19c = local_10c.vect[1];
      uVar2 = _local_1a0;
      local_198 = local_10c.vect[2];
      local_b8 = &local_194;
      local_c0 = &local_1a0;
      local_8c = 0;
      local_1a0 = local_10c.vect[0];
      local_194.vect[0] = local_194.vect[0] - local_1a0;
      local_9c = 1;
      iStack_19c = local_10c.vect[1];
      local_194.vect[1] = local_194.vect[1] - iStack_19c;
      local_ac = 2;
      local_194.vect[2] = local_194.vect[2] - local_10c.vect[2];
      (in_stack_fffffffffffffe18->smallend).vect[0] =
           *(int *)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start * (in_stack_fffffffffffffe18->smallend).vect[0]
      ;
      (in_stack_fffffffffffffe18->smallend).vect[1] =
           *(int *)((long)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start + 4) *
           (in_stack_fffffffffffffe18->smallend).vect[1];
      (in_stack_fffffffffffffe18->smallend).vect[2] =
           *(int *)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish *
           (in_stack_fffffffffffffe18->smallend).vect[2];
      local_170 = &in_stack_fffffffffffffe18->bigend;
      local_178 = &local_194;
      local_144 = 0;
      local_170->vect[0] = local_194.vect[0] + local_170->vect[0];
      local_154 = 1;
      (in_stack_fffffffffffffe18->bigend).vect[1] =
           local_194.vect[1] + (in_stack_fffffffffffffe18->bigend).vect[1];
      local_164 = 2;
      (in_stack_fffffffffffffe18->bigend).vect[2] =
           local_194.vect[2] + (in_stack_fffffffffffffe18->bigend).vect[2];
      (in_stack_fffffffffffffe18->bigend).vect[0] =
           *(int *)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_start * (in_stack_fffffffffffffe18->bigend).vect[0];
      (in_stack_fffffffffffffe18->bigend).vect[1] =
           *(int *)((long)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_start + 4) *
           (in_stack_fffffffffffffe18->bigend).vect[1];
      (in_stack_fffffffffffffe18->bigend).vect[2] =
           *(int *)&(local_188->super_vector<amrex::Box,_std::allocator<amrex::Box>_>).
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish * (in_stack_fffffffffffffe18->bigend).vect[2];
      local_f8 = &in_stack_fffffffffffffe18->bigend;
      local_100 = &local_194;
      local_cc = 0;
      local_f8->vect[0] = local_f8->vect[0] - local_194.vect[0];
      local_dc = 1;
      (in_stack_fffffffffffffe18->bigend).vect[1] =
           (in_stack_fffffffffffffe18->bigend).vect[1] - local_194.vect[1];
      local_ec = 2;
      (in_stack_fffffffffffffe18->bigend).vect[2] =
           (in_stack_fffffffffffffe18->bigend).vect[2] - local_194.vect[2];
      _local_1a0 = uVar2;
      local_160 = local_178;
      local_150 = local_178;
      local_140 = local_178;
      local_e8 = local_100;
      local_d8 = local_100;
      local_c8 = local_100;
      local_a8 = local_c0;
      local_98 = local_c0;
    }
  }
  return in_RDI;
}

Assistant:

BoxArray&
BoxArray::refine (const IntVect& iv)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        BL_ASSERT(m_ref->m_abox[i].ok());
        m_ref->m_abox[i].refine(iv);
    }
    return *this;
}